

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5DlidxIterPrevR(Fts5Index *p,Fts5DlidxIter *pIter,int iLvl)

{
  long *plVar1;
  int iVar2;
  int iVar3;
  u8 *puVar4;
  Fts5DlidxLvl *pFVar5;
  int iVar6;
  uint uVar7;
  Fts5Data *pFVar8;
  Fts5Data *pFVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  Fts5DlidxLvl *pLvl;
  long lVar14;
  int iVar15;
  int iVar16;
  u64 local_38;
  
  pFVar8 = (Fts5Data *)((long)iLvl * 0x20);
  pFVar5 = pIter->aLvl;
  pLvl = (Fts5DlidxLvl *)((long)&pFVar8->p + (long)pFVar5);
  iVar2 = *(int *)((long)&pFVar8->nn + (long)pFVar5);
  iVar3 = *(int *)((long)&pFVar8[1].p + (long)pFVar5);
  if (iVar3 < iVar2) {
    iVar11 = iVar2 + -9;
    if (iVar2 < 10) {
      iVar11 = 0;
    }
    puVar4 = pLvl->pData->p;
    iVar16 = iVar2 + -1;
    if (iVar11 <= iVar2 + -1) {
      iVar16 = iVar11;
    }
    iVar6 = 0;
    lVar10 = (long)iVar2;
    do {
      iVar15 = iVar6;
      if (lVar10 + -1 <= (long)iVar11) goto LAB_001a4c4d;
      lVar13 = lVar10 + -2;
      iVar6 = iVar15 + 1;
      lVar10 = lVar10 + -1;
    } while ((char)puVar4[lVar13] < '\0');
    iVar16 = iVar2 - (iVar15 + 1);
LAB_001a4c4d:
    sqlite3Fts5GetVarint(puVar4 + iVar16,&local_38);
    plVar1 = (long *)((long)&pFVar8[1].nn + (long)pFVar5);
    *plVar1 = *plVar1 - local_38;
    iVar11 = *(int *)((long)&pFVar8[1].p + (long)((long)&pFVar5->pData + 4)) + -1;
    *(int *)((long)&pFVar8[1].p + (long)((long)&pFVar5->pData + 4)) = iVar11;
    lVar13 = (long)((iVar2 + -2) - iVar15);
    lVar14 = lVar13 << 0x20;
    for (lVar10 = 0; uVar7 = (uint)lVar10, (long)iVar3 <= lVar13 + lVar10; lVar10 = lVar10 + -1) {
      if (puVar4[lVar10 + lVar13] != '\0') {
        uVar12 = -uVar7;
        if (-1 < (char)puVar4[lVar14 >> 0x20]) goto LAB_001a4d01;
        if ((iVar2 - iVar15) + -10 < iVar3) goto LAB_001a4cff;
        lVar10 = 8;
        goto LAB_001a4cef;
      }
      iVar15 = iVar15 + 1;
      lVar14 = lVar14 + -0x100000000;
    }
    uVar12 = -uVar7;
    goto LAB_001a4d01;
  }
  *(undefined4 *)((long)&pFVar8->szLeaf + (long)pFVar5) = 1;
  pFVar9 = pFVar8;
  goto LAB_001a4d26;
  while (lVar13 = lVar10 + (long)((iVar2 + -2) - iVar15) + -9, lVar10 = lVar10 + -1,
        (char)puVar4[lVar13] < '\0') {
LAB_001a4cef:
    if (lVar10 == 0) goto LAB_001a4d01;
  }
LAB_001a4cff:
  uVar12 = ~uVar7;
LAB_001a4d01:
  uVar7 = iVar11 - uVar12;
  pFVar9 = (Fts5Data *)(ulong)uVar7;
  *(uint *)((long)&pFVar8[1].p + (long)((long)&pFVar5->pData + 4)) = uVar7;
  *(uint *)((long)&pFVar8->nn + (long)pFVar5) = iVar16 - uVar12;
  if (*(int *)((long)&pFVar8->szLeaf + (long)pFVar5) == 0) goto LAB_001a4d92;
LAB_001a4d26:
  if (iLvl + 1 < pIter->nLvl) {
    uVar7 = fts5DlidxIterPrevR(p,pIter,iLvl + 1);
    pFVar9 = (Fts5Data *)(ulong)uVar7;
    if (*(int *)((long)&pFVar8[2].szLeaf + (long)pFVar5) == 0) {
      sqlite3_free(pLvl->pData);
      *(undefined8 *)((long)&pFVar8[1].p + (long)pFVar5) = 0;
      *(undefined8 *)((long)&pFVar8[1].nn + (long)pFVar5) = 0;
      pLvl->pData = (Fts5Data *)0x0;
      *(undefined8 *)((long)&pFVar8->nn + (long)pFVar5) = 0;
      pFVar9 = fts5DataRead(p,(long)*(int *)((long)&pFVar8[3].p + (long)((long)&pFVar5->pData + 4))
                              + (long)iLvl * 0x80000000 + ((ulong)(uint)pIter->iSegid << 0x25) +
                              0x1000000000);
      pLvl->pData = pFVar9;
      if (pFVar9 != (Fts5Data *)0x0) {
        do {
          uVar7 = fts5DlidxLvlNext(pLvl);
          pFVar9 = (Fts5Data *)(ulong)uVar7;
        } while (uVar7 == 0);
        *(undefined4 *)((long)&pFVar8->szLeaf + (long)pFVar5) = 0;
      }
    }
  }
LAB_001a4d92:
  return (int)pFVar9;
}

Assistant:

static int fts5DlidxIterPrevR(Fts5Index *p, Fts5DlidxIter *pIter, int iLvl){
  Fts5DlidxLvl *pLvl = &pIter->aLvl[iLvl];

  assert( iLvl<pIter->nLvl );
  if( fts5DlidxLvlPrev(pLvl) ){
    if( (iLvl+1) < pIter->nLvl ){
      fts5DlidxIterPrevR(p, pIter, iLvl+1);
      if( pLvl[1].bEof==0 ){
        fts5DataRelease(pLvl->pData);
        memset(pLvl, 0, sizeof(Fts5DlidxLvl));
        pLvl->pData = fts5DataRead(p, 
            FTS5_DLIDX_ROWID(pIter->iSegid, iLvl, pLvl[1].iLeafPgno)
        );
        if( pLvl->pData ){
          while( fts5DlidxLvlNext(pLvl)==0 );
          pLvl->bEof = 0;
        }
      }
    }
  }

  return pIter->aLvl[0].bEof;
}